

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLrelation.c
# Opt level: O1

void RDL_checkDependencies(RDL_cfURF *RCFs,RDL_graph *graph,RDL_URFinfo *uInfo)

{
  uint uVar1;
  RDL_cfam **ppRVar2;
  uchar uVar3;
  uint uVar4;
  ulong uVar5;
  uchar **rows;
  uchar **rows_00;
  uchar **rows_01;
  void *__ptr;
  uchar *empty_cycle;
  uint *puVar6;
  uchar *bitset;
  uchar *bitset_00;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uchar **compressed;
  uint uVar10;
  uint pos;
  ulong uVar11;
  uint local_ac;
  uint local_98;
  ulong local_80;
  ulong local_70;
  
  uVar5 = (ulong)RCFs->nofFams;
  if (uVar5 < 3) {
    if (uInfo->nofWeights != 0) {
      uVar5 = 0;
      do {
        if (uInfo->nofProtos[uVar5] != 0) {
          uVar8 = 0;
          do {
            uInfo->URFrel[uVar5][uVar8][uVar8] = '\x01';
            uVar8 = uVar8 + 1;
          } while (uVar8 < uInfo->nofProtos[uVar5]);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uInfo->nofWeights);
    }
    uVar4 = RCFs->nofFams;
    if ((ulong)uVar4 != 0) {
      ppRVar2 = RCFs->fams;
      uVar5 = 0;
      do {
        ppRVar2[uVar5]->mark = 1;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    return;
  }
  rows = (uchar **)malloc((ulong)((graph->E - graph->V) + 1) << 3);
  rows_00 = (uchar **)malloc(uVar5 * 8);
  rows_01 = (uchar **)malloc(uVar5 * 8);
  __ptr = malloc(uVar5 << 2);
  uVar4 = 0;
  if (RCFs->nofFams != 0) {
    uVar5 = 0;
    compressed = rows_00;
    do {
      uVar4 = RDL_bitset_compressed(compressed,RCFs->fams[uVar5]->prototype,graph->E);
      uVar5 = uVar5 + 1;
      compressed = compressed + 1;
    } while (uVar5 < RCFs->nofFams);
  }
  uVar5 = 0;
  uVar8 = (ulong)uVar4;
  empty_cycle = (uchar *)malloc(uVar8);
  memset(empty_cycle,0,uVar8);
  local_ac = 0;
  if (uInfo->nofWeights != 0) {
    uVar11 = 0;
    local_ac = 0;
    local_98 = 0;
    do {
      puVar6 = uInfo->nofProtos;
      uVar1 = local_ac;
      if (puVar6[uVar11] == 0) {
        uVar5 = (ulong)local_98;
      }
      else {
        local_80 = 0;
        local_70 = (ulong)local_98;
        do {
          if (uVar11 == 0) {
            iVar7 = 0;
          }
          else {
            uVar5 = 0;
            iVar7 = 0;
            do {
              iVar7 = iVar7 + puVar6[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar11 != uVar5);
          }
          uVar9 = (int)local_80 + iVar7;
          bitset = (uchar *)malloc(uVar8);
          memcpy(bitset,rows_00[uVar9],uVar8);
          if (local_ac != 0) {
            uVar5 = 0;
            do {
              uVar3 = RDL_bitset_test(bitset,(uint)uVar5);
              if (uVar3 != '\0') {
                RDL_bitset_xor_inplace(bitset,rows[uVar5],uVar4);
              }
              uVar5 = uVar5 + 1;
            } while (local_ac != uVar5);
          }
          iVar7 = RDL_bitset_empty(bitset,empty_cycle,uVar4);
          uVar10 = uVar1;
          if (iVar7 == 0) {
            rows_01[local_70] = bitset;
            *(int *)((long)__ptr + local_70 * 4) = (int)local_80;
            RCFs->fams[uVar9]->mark = 1;
            uInfo->URFrel[uVar11][local_80][local_80] = '\x01';
            bitset_00 = (uchar *)malloc(uVar8);
            memcpy(bitset_00,bitset,uVar8);
            if (local_ac < uVar1) {
              uVar5 = (ulong)local_ac;
              do {
                uVar3 = RDL_bitset_test(bitset_00,(uint)uVar5);
                if (uVar3 != '\0') {
                  RDL_bitset_xor_inplace(bitset_00,rows[uVar5],uVar4);
                }
                uVar5 = uVar5 + 1;
              } while (uVar1 != uVar5);
            }
            uVar9 = (uint)local_70 + 1;
            uVar5 = (ulong)uVar9;
            iVar7 = RDL_bitset_empty(bitset_00,empty_cycle,uVar4);
            if (iVar7 == 0) {
              rows[uVar1] = bitset_00;
              uVar10 = uVar1 + 1;
              uVar3 = RDL_bitset_test(bitset_00,uVar1);
              if ((uVar3 == '\0') && (pos = uVar10, uVar10 < graph->E)) {
                do {
                  uVar3 = RDL_bitset_test(bitset_00,pos);
                  if (uVar3 != '\0') {
                    RDL_swap_columns(rows,uVar10,uVar1,pos);
                    RDL_swap_columns(rows_01,uVar9,uVar1,pos);
                    RDL_swap_columns(rows_00,RCFs->nofFams,uVar1,pos);
                    uVar5 = (ulong)uVar9;
                    break;
                  }
                  pos = pos + 1;
                } while (pos < graph->E);
              }
            }
            else {
              uVar5 = (ulong)local_98;
              if (local_98 < (uint)local_70) {
                do {
                  memcpy(bitset_00,bitset,uVar8);
                  RDL_bitset_xor_inplace(bitset_00,rows_01[uVar5],uVar4);
                  iVar7 = RDL_bitset_empty(bitset_00,empty_cycle,uVar4);
                  if (iVar7 != 0) {
                    uVar1 = *(uint *)((long)__ptr + uVar5 * 4);
                    uInfo->URFrel[uVar11][local_80][uVar1] = '\x01';
                    uInfo->URFrel[uVar11][uVar1][local_80] = '\x01';
                  }
                  uVar5 = uVar5 + 1;
                } while (local_70 != uVar5);
              }
              free(bitset_00);
              uVar5 = (ulong)uVar9;
            }
          }
          else {
            free(bitset);
            uVar5 = local_70;
          }
          uVar1 = uVar10;
          local_80 = local_80 + 1;
          puVar6 = uInfo->nofProtos;
          local_70 = uVar5;
        } while (local_80 < puVar6[uVar11]);
      }
      local_ac = uVar1;
      uVar11 = uVar11 + 1;
      local_98 = (uint)uVar5;
    } while (uVar11 < uInfo->nofWeights);
  }
  if (local_ac != 0) {
    uVar8 = 0;
    do {
      free(rows[uVar8]);
      uVar8 = uVar8 + 1;
    } while (local_ac != uVar8);
  }
  free(rows);
  if ((int)uVar5 != 0) {
    uVar8 = 0;
    do {
      free(rows_01[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  free(rows_01);
  free(__ptr);
  if (RCFs->nofFams != 0) {
    uVar5 = 0;
    do {
      free(rows_00[uVar5]);
      uVar5 = uVar5 + 1;
    } while (uVar5 < RCFs->nofFams);
  }
  free(rows_00);
  free(empty_cycle);
  return;
}

Assistant:

void RDL_checkDependencies(RDL_cfURF *RCFs, RDL_graph *graph, RDL_URFinfo *uInfo)
{
  unsigned i,j,k, index;

  /* this array contains the basis cycles in row echelon form */
  unsigned char **compressedBasisCycles;
  unsigned maxBasisCyclesSize = graph->E - graph->V + 1;
  unsigned currentBasisCyclesSize = 0;
  unsigned currentBasisCyclesSmallerEnd = 0;
  unsigned oldBasisCyclesSize;
  unsigned compressedSize = 0;

  unsigned char **compressedRelevantCycles;
  unsigned currentRelevantCyclesSize = 0;
  unsigned currentRelevantCyclesSmallerEnd = 0;
  unsigned *relevantCyclesMap;

  unsigned char *compressedCycleWithSmallerAdded;
  unsigned char *compressedCycleWithEqualAdded;
  unsigned char **compressedPrototypesForGaussian;

  const unsigned char* empty_cycle;

  if(RCFs->nofFams < 3) {
    /*if only 0, 1 or 2 families exist, they are all relevant and independent*/
    for(i=0; i<uInfo->nofWeights; ++i) {
      for(j=0; j<uInfo->nofProtos[i]; ++j) {
        uInfo->URFrel[i][j][j] = 1; /*URF-related to itself*/
      }
    }
    for(i=0; i<RCFs->nofFams; ++i) {
      RCFs->fams[i]->mark = 1;
    }
    return;
  }

  compressedBasisCycles = malloc(maxBasisCyclesSize * sizeof(*compressedBasisCycles));
  compressedPrototypesForGaussian = malloc(RCFs->nofFams * sizeof(*compressedPrototypesForGaussian));
  compressedRelevantCycles = malloc(RCFs->nofFams * sizeof(*compressedRelevantCycles));
  relevantCyclesMap = malloc(RCFs->nofFams * sizeof(*relevantCyclesMap));

  /* copy the prototypes for gaussian elimination */
  for (i = 0; i < RCFs->nofFams; ++i) {
    compressedSize = RDL_bitset_compressed(
        &(compressedPrototypesForGaussian[i]), RCFs->fams[i]->prototype, graph->E);
  }
  empty_cycle = malloc(compressedSize * sizeof(*empty_cycle));
  memset((unsigned char*)empty_cycle, 0, compressedSize * sizeof(*empty_cycle));
  /* printf("%d %d\n", compressedSize, graph->E); */

  /* iterate over all weights */
  for (i = 0; i < uInfo->nofWeights; ++i) {
    /* reset indices indication the first index of larger cycles */
    currentBasisCyclesSmallerEnd = currentBasisCyclesSize;
    currentRelevantCyclesSmallerEnd = currentRelevantCyclesSize;
    for (j = 0; j < uInfo->nofProtos[i]; ++j) {

      index = RDL_idxWeights(uInfo, i, j);
      /* copy current cycle */
      compressedCycleWithSmallerAdded = malloc(compressedSize * sizeof(*compressedCycleWithSmallerAdded));
      memcpy(compressedCycleWithSmallerAdded, compressedPrototypesForGaussian[index],
          compressedSize * sizeof(*compressedCycleWithSmallerAdded));

      /*
       * add smaller cycles of the basis (set B<)
       *
       * the basisCycles are in row echelon form (see below), so we add each cycle that
       * has a 1 at position k (all smaller positions are 0, row echelon)
       *
       * [this corresponds to the "add row operation" of gaussian elimination]
       */
      for (k = 0; k < currentBasisCyclesSmallerEnd; ++k) {
        if (RDL_bitset_test(compressedCycleWithSmallerAdded, k)) {
          RDL_bitset_xor_inplace(compressedCycleWithSmallerAdded,
              compressedBasisCycles[k], compressedSize);
        }
      }

      /*
       * if the result is empty, then this cycle linearly depends
       * on smaller cycles of the basis B<
       *
       * => trivial
       * <= is also true because adding more smaller cycles can't make
       * the cycle 0 (how could it?)
       */
      if (RDL_bitset_empty(compressedCycleWithSmallerAdded, empty_cycle, compressedSize)) {
        free(compressedCycleWithSmallerAdded);
        continue;
      }

      /* this cycle does not depend on strictly smaller cycles => relevant */
      compressedRelevantCycles[currentRelevantCyclesSize] = compressedCycleWithSmallerAdded;
      relevantCyclesMap[currentRelevantCyclesSize] = j; /* this is no bug, we really need the "internal" index */
      ++currentRelevantCyclesSize;

      RCFs->fams[index]->mark = 1;
      uInfo->URFrel[i][j][j] = 1; /*URF-related to itself*/

      /* make a copy for adding the equal sized cycles */
      compressedCycleWithEqualAdded = malloc(compressedSize * sizeof(*compressedCycleWithEqualAdded));
      memcpy(compressedCycleWithEqualAdded, compressedCycleWithSmallerAdded,
          compressedSize * sizeof(*compressedCycleWithSmallerAdded));

      /*
       * add equal sized cycles of the basis (set B=)
       *
       * the same arguments as for the smaller cycles apply
       */
      for (k = currentBasisCyclesSmallerEnd; k < currentBasisCyclesSize; ++k) {
        if (RDL_bitset_test(compressedCycleWithEqualAdded, k)) {
          RDL_bitset_xor_inplace(compressedCycleWithEqualAdded,
              compressedBasisCycles[k], compressedSize);
        }
      }

      if (RDL_bitset_empty(compressedCycleWithEqualAdded, empty_cycle, compressedSize)) {
        /*
         * if the cycle depends linearly on any equal sized cycle of the
         * basis (B=), we check all RELEVANT cycles we've seen so far for
         * linear dependence
         *
         * (-1 because we don't have to add the ring to itself)
         */

        for (k = currentRelevantCyclesSmallerEnd; k < currentRelevantCyclesSize-1; ++k) {
          memcpy(compressedCycleWithEqualAdded, compressedCycleWithSmallerAdded,
              compressedSize * sizeof(*compressedCycleWithSmallerAdded));
          RDL_bitset_xor_inplace(compressedCycleWithEqualAdded,
              compressedRelevantCycles[k], compressedSize);
          if (RDL_bitset_empty(compressedCycleWithEqualAdded, empty_cycle, compressedSize)) {
            /*
             * if there is any equal sized cycle that is in fact equal to the current cycle
             * (after adding smaller cycles) => those cycles fulfill URF condition 1 (equal size)
             * and also condition 3 (depended on each other and smaller cycles)
             */
            uInfo->URFrel[i][j][relevantCyclesMap[k]] = 1;
            uInfo->URFrel[i][relevantCyclesMap[k]][j] = 1;
          }
        }

        free(compressedCycleWithEqualAdded);
      }
      else {
        /*
         * the current cycle is also independent of equal sized cycles,
         * so it's part of the basis, add it to B=
         *
         * (so it can't be depedent of any equal sized ring seen so far,
         * so URF relation is out of discussion)
         */
        oldBasisCyclesSize = currentBasisCyclesSize;
        compressedBasisCycles[currentBasisCyclesSize] = compressedCycleWithEqualAdded;
        ++currentBasisCyclesSize;

        /*
         * this is where the magic is happening: ensure that the basis is
         * indeed in row echelon form (we use the property throughout the algorithm)
         *
         * swap columns such that indeed the current ring with index currentBasisCycleSize-1
         * has a 1 at column currentBasisCycleSize-1
         * => ROW ECHELON FORM
         *
         * [this corresponds to the "swap columns operation" of gaussian elimination]
         */
        if (!RDL_bitset_test(compressedCycleWithEqualAdded, oldBasisCyclesSize)) {
          for (k = oldBasisCyclesSize + 1; k < graph->E; ++k) {
            if (RDL_bitset_test(compressedCycleWithEqualAdded, k)) {
              RDL_swap_columns(compressedBasisCycles, currentBasisCyclesSize, oldBasisCyclesSize, k);
              RDL_swap_columns(compressedRelevantCycles, currentRelevantCyclesSize, oldBasisCyclesSize, k);
              RDL_swap_columns(compressedPrototypesForGaussian, RCFs->nofFams, oldBasisCyclesSize, k);
              break;
            }
          }
        }
      }

    }
  }

  for (i = 0; i < currentBasisCyclesSize; ++i) {
    free(compressedBasisCycles[i]);
  }
  free(compressedBasisCycles);

  for (i = 0; i < currentRelevantCyclesSize; ++i) {
    free(compressedRelevantCycles[i]);
  }
  free(compressedRelevantCycles);
  free(relevantCyclesMap);

  for (i = 0; i < RCFs->nofFams; ++i) {
    free(compressedPrototypesForGaussian[i]);
  }
  free(compressedPrototypesForGaussian);
  free((void*)empty_cycle);
}